

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O2

void __thiscall QDesktopUnixServices::setApplicationBadge(QDesktopUnixServices *this,qint64 number)

{
  QVariant *pQVar1;
  QLoggingCategory *pQVar2;
  P _b;
  long lVar3;
  longlong lVar4;
  long in_FS_OFFSET;
  initializer_list<QVariant> args;
  QArrayDataPointer<char16_t> local_180;
  QArrayDataPointer<char16_t> local_168;
  QDBusMessage signal;
  QMap<QString,_QVariant> local_148;
  QArrayDataPointer<char16_t> local_140;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_110;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QStringBuilder<QString,_QString> local_c8;
  QArrayDataPointer<char16_t> local_98;
  anon_union_24_3_e3d07ef4_for_data local_80;
  char *local_68;
  QVariant local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::desktopFileName();
  lVar3 = CONCAT44(local_80._20_4_,local_80._16_4_);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
  if (lVar3 == 0) {
    pQVar2 = QtPrivateLogging::lcQpaServices();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_68 = pQVar2->name;
      local_80._0_4_ = 2;
      local_80._4_8_ = 0;
      local_80._12_4_ = 0;
      local_80._16_4_ = 0;
      local_80._20_4_ = 0;
      QMessageLogger::warning
                ((char *)local_80.data,
                 "Cannot set badge number - QGuiApplication::desktopFileName() is empty");
    }
  }
  else {
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_e0.d = (Data *)0x0;
    local_f8.d = (Data *)0x0;
    local_f8.ptr = (char16_t *)0x0;
    local_e0.ptr = L"application://";
    local_f8.size = 0;
    local_e0.size = 0xe;
    QGuiApplication::desktopFileName();
    QStringBuilder<QString,_QString>::QStringBuilder
              (&local_c8,(QString *)&local_e0,(QString *)&local_110);
    local_128.d = (Data *)0x0;
    local_140.d = (Data *)0x0;
    local_140.ptr = (char16_t *)0x0;
    local_128.ptr = L".desktop";
    local_140.size = 0;
    local_128.size = 8;
    QStringBuilder<QStringBuilder<QString,_QString>,_QString>::QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QString>,_QString> *)&local_80,&local_c8,
               (QString *)&local_128);
    QStringBuilder<QStringBuilder<QString,_QString>,_QString>::convertTo<QString>
              ((QString *)&local_98,
               (QStringBuilder<QStringBuilder<QString,_QString>,_QString> *)&local_80);
    QStringBuilder<QStringBuilder<QString,_QString>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<QString,_QString>,_QString> *)&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_140);
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    local_148.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )0x0;
    if (number < 1) {
      ::QVariant::QVariant((QVariant *)&local_80,false);
      local_c8.a.d.d = (Data *)0x0;
      local_e0.d = (Data *)0x0;
      local_e0.ptr = (char16_t *)0x0;
      local_c8.a.d.ptr = L"count-visible";
      local_e0.size = 0;
      local_c8.a.d.size = 0xd;
      pQVar1 = QMap<QString,_QVariant>::operator[](&local_148,&local_c8.a);
      ::QVariant::operator=(pQVar1,(QVariant *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    }
    else {
      lVar4 = 9999;
      if ((ulong)number < 9999) {
        lVar4 = number;
      }
      ::QVariant::QVariant((QVariant *)&local_80,lVar4);
      local_c8.a.d.d = (Data *)0x0;
      local_e0.d = (Data *)0x0;
      local_e0.ptr = (char16_t *)0x0;
      local_c8.a.d.ptr = L"count";
      local_e0.size = 0;
      local_c8.a.d.size = 5;
      pQVar1 = QMap<QString,_QVariant>::operator[](&local_148,&local_c8.a);
      ::QVariant::operator=(pQVar1,(QVariant *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
      ::QVariant::~QVariant((QVariant *)&local_80);
      ::QVariant::QVariant((QVariant *)&local_80,true);
      local_c8.a.d.d = (Data *)0x0;
      local_e0.d = (Data *)0x0;
      local_e0.ptr = (char16_t *)0x0;
      local_c8.a.d.ptr = L"count-visible";
      local_e0.size = 0;
      local_c8.a.d.size = 0xd;
      pQVar1 = QMap<QString,_QVariant>::operator[](&local_148,&local_c8.a);
      ::QVariant::operator=(pQVar1,(QVariant *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    }
    ::QVariant::~QVariant((QVariant *)&local_80);
    _signal = &DAT_aaaaaaaaaaaaaaaa;
    local_e0.d = (Data *)0x0;
    local_f8.d = (Data *)0x0;
    local_f8.ptr = (char16_t *)0x0;
    local_e0.ptr = L"/com/canonical/unity/launcherentry/";
    local_f8.size = 0;
    local_e0.size = 0x23;
    QCoreApplication::applicationName();
    QStringBuilder<QString,_QString>::QStringBuilder
              ((QStringBuilder<QString,_QString> *)&local_80,(QString *)&local_e0,
               (QString *)&local_110);
    QStringBuilder<QString,_QString>::convertTo<QString>
              (&local_c8.a,(QStringBuilder<QString,_QString> *)&local_80);
    local_128.d = (Data *)0x0;
    local_140.d = (Data *)0x0;
    local_140.ptr = (char16_t *)0x0;
    local_128.ptr = L"com.canonical.Unity.LauncherEntry";
    local_140.size = 0;
    local_128.size = 0x21;
    local_168.d = (Data *)0x0;
    local_180.d = (Data *)0x0;
    local_180.ptr = (char16_t *)0x0;
    local_168.ptr = L"Update";
    local_180.size = 0;
    local_168.size = 6;
    QDBusMessage::createSignal((QString *)&signal,(QString *)&local_c8,(QString *)&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_140);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)&local_80)
    ;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    ::QVariant::QVariant((QVariant *)&local_80,(QString *)&local_98);
    ::QVariant::QVariant(&local_60,(QMap *)&local_148);
    args._M_len = 2;
    args._M_array = (iterator)&local_80;
    QList<QVariant>::QList((QList<QVariant> *)&local_c8,args);
    QDBusMessage::setArguments((QList_conflict1 *)&signal);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_c8);
    lVar3 = 0x20;
    do {
      ::QVariant::~QVariant((QVariant *)((long)&local_80 + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
    QDBusConnection::sessionBus();
    QDBusConnection::send((QDBusMessage *)local_80.data);
    QDBusConnection::~QDBusConnection((QDBusConnection *)local_80.data);
    QDBusMessage::~QDBusMessage(&signal);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_148.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDesktopUnixServices::setApplicationBadge(qint64 number)
{
#if QT_CONFIG(dbus)
    if (qGuiApp->desktopFileName().isEmpty()) {
        qCWarning(lcQpaServices, "Cannot set badge number - QGuiApplication::desktopFileName() is empty");
        return;
    }


    const QString launcherUrl = QStringLiteral("application://") + qGuiApp->desktopFileName() + QStringLiteral(".desktop");
    const qint64 count = qBound(0, number, 9999);
    QVariantMap dbusUnityProperties;

    if (count > 0) {
        dbusUnityProperties[QStringLiteral("count")] = count;
        dbusUnityProperties[QStringLiteral("count-visible")] = true;
    } else {
        dbusUnityProperties[QStringLiteral("count-visible")] = false;
    }

    auto signal = QDBusMessage::createSignal(QStringLiteral("/com/canonical/unity/launcherentry/")
        + qGuiApp->applicationName(), QStringLiteral("com.canonical.Unity.LauncherEntry"), QStringLiteral("Update"));

    signal.setArguments({launcherUrl, dbusUnityProperties});

    QDBusConnection::sessionBus().send(signal);
#else
    Q_UNUSED(number)
#endif
}